

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O3

array<ImVec2,_4UL> *
VHMBBCalculate(array<ImVec2,_4UL> *__return_storage_ptr__,
              vector<ImVec2,_std::allocator<ImVec2>_> *hull,double psz)

{
  ImVec2 *pIVar1;
  ImVec2 *pIVar2;
  ImVec2 IVar3;
  float fVar4;
  undefined1 auVar5 [16];
  pointer pIVar6;
  ulong uVar7;
  pointer pIVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ImVec2 IVar16;
  ImVec2 IVar17;
  ImVec2 IVar18;
  ImVec2 IVar19;
  ImVec2 IVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  double dVar33;
  float fVar34;
  float fVar35;
  double local_110;
  undefined8 local_f8;
  undefined8 local_e8;
  double local_c8;
  double local_a8;
  double local_90;
  undefined8 local_88;
  undefined8 local_78;
  
  __return_storage_ptr__->_M_elems[2].x = 0.0;
  __return_storage_ptr__->_M_elems[2].y = 0.0;
  __return_storage_ptr__->_M_elems[3].x = 0.0;
  __return_storage_ptr__->_M_elems[3].y = 0.0;
  local_78 = 0;
  __return_storage_ptr__->_M_elems[0].x = 0.0;
  __return_storage_ptr__->_M_elems[0].y = 0.0;
  __return_storage_ptr__->_M_elems[1].x = 0.0;
  __return_storage_ptr__->_M_elems[1].y = 0.0;
  pIVar6 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar8 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_110 = 0.0;
  if ((long)pIVar8 - (long)pIVar6 == 0) {
    local_88 = 0x7f8000007f800000;
  }
  else {
    uVar7 = (long)pIVar8 - (long)pIVar6 >> 3;
    lVar9 = 0;
    auVar22 = _DAT_001e9380;
    do {
      auVar24._8_8_ = 0;
      auVar24._0_4_ = pIVar6[lVar9].x;
      auVar24._4_4_ = pIVar6[lVar9].y;
      auVar22 = minps(auVar24,auVar22);
      local_88 = auVar22._0_8_;
      lVar9 = lVar9 + 1;
    } while (uVar7 + (uVar7 == 0) != lVar9);
    if (pIVar8 == pIVar6) {
      fVar34 = 0.0;
      fVar35 = 0.0;
      goto LAB_0010d77f;
    }
    lVar9 = 0;
    do {
      IVar3.y = pIVar6[lVar9].y - auVar22._4_4_;
      IVar3.x = pIVar6[lVar9].x - auVar22._0_4_;
      pIVar6[lVar9] = IVar3;
      lVar9 = lVar9 + 1;
    } while (uVar7 + (uVar7 == 0) != lVar9);
    if (pIVar8 != pIVar6) {
      fVar34 = 0.0;
      fVar35 = 0.0;
      local_90 = 1.79769313486232e+308;
      local_110 = 0.0;
      uVar10 = 0;
      dVar33 = 0.0;
      local_78 = 0;
      do {
        pIVar8 = pIVar6 + uVar10;
        uVar10 = uVar10 + 1;
        dVar11 = atan2((double)(pIVar6[(ulong)(long)(int)uVar10 % uVar7].y - (*pIVar8).y),
                       (double)(pIVar6[(ulong)(long)(int)uVar10 % uVar7].x - (*pIVar8).x));
        pIVar6 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pIVar8 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar22 = _DAT_001e93a0;
        auVar24 = _DAT_001e9390;
        if (pIVar8 != pIVar6) {
          local_c8 = -dVar11;
          uVar7 = 0;
          uVar25 = 0;
          uVar26 = 0x100000;
          uVar27 = 0;
          uVar28 = 0x100000;
          uVar29 = 0xffffffff;
          uVar30 = 0x7fefffff;
          uVar31 = 0xffffffff;
          uVar32 = 0x7fefffff;
          do {
            IVar3 = pIVar6[uVar7];
            dVar12 = (double)IVar3.x;
            cos(local_c8);
            local_f8._4_4_ = IVar3.y;
            local_e8 = (double)CONCAT44(local_f8._4_4_,local_f8._4_4_);
            dVar13 = sin(local_c8);
            dVar14 = sin(local_c8);
            dVar15 = cos(local_c8);
            IVar16.x = (float)(local_e8 * dVar12 + -dVar13 * (double)local_f8._4_4_);
            IVar16.y = (float)(dVar14 * dVar12 + dVar15 * (double)local_f8._4_4_);
            (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar7] = IVar16;
            auVar23._0_8_ = (double)IVar16.x;
            auVar23._8_8_ = (double)IVar16.y;
            auVar21._8_8_ = auVar23._8_8_;
            auVar21._0_8_ = auVar23._0_8_;
            auVar22._4_4_ = uVar26;
            auVar22._0_4_ = uVar25;
            auVar22._8_4_ = uVar27;
            auVar22._12_4_ = uVar28;
            auVar22 = maxpd(auVar21,auVar22);
            auVar5._4_4_ = uVar30;
            auVar5._0_4_ = uVar29;
            auVar5._8_4_ = uVar31;
            auVar5._12_4_ = uVar32;
            auVar24 = minpd(auVar23,auVar5);
            uVar7 = uVar7 + 1;
            pIVar6 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pIVar8 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            uVar25 = auVar22._0_4_;
            uVar26 = auVar22._4_4_;
            uVar27 = auVar22._8_4_;
            uVar28 = auVar22._12_4_;
            uVar29 = auVar24._0_4_;
            uVar30 = auVar24._4_4_;
            uVar31 = auVar24._8_4_;
            uVar32 = auVar24._12_4_;
          } while (uVar7 < (ulong)((long)pIVar8 - (long)pIVar6 >> 3));
        }
        dVar33 = dVar33 + dVar11;
        dVar11 = (auVar22._8_8_ - auVar24._8_8_) * (auVar22._0_8_ - auVar24._0_8_);
        if (dVar11 < local_90) {
          local_78 = CONCAT44((float)auVar24._8_8_,(float)auVar24._0_8_);
          fVar34 = (float)auVar22._0_8_;
          fVar35 = (float)auVar22._8_8_;
          local_110 = dVar33;
          local_90 = dVar11;
        }
        uVar7 = (long)pIVar8 - (long)pIVar6 >> 3;
      } while (uVar10 < uVar7);
      goto LAB_0010d77f;
    }
  }
  fVar34 = 0.0;
  fVar35 = 0.0;
LAB_0010d77f:
  dVar15 = (double)(float)((double)(float)local_78 - psz);
  dVar33 = cos(local_110);
  dVar11 = (double)(float)((double)local_78._4_4_ - psz);
  local_a8 = sin(local_110);
  local_a8 = -local_a8;
  dVar12 = sin(local_110);
  dVar13 = cos(local_110);
  IVar17.x = (float)(dVar33 * dVar15 + local_a8 * dVar11);
  IVar17.y = (float)(dVar12 * dVar15 + dVar13 * dVar11);
  __return_storage_ptr__->_M_elems[0] = IVar17;
  dVar33 = (double)(float)((double)fVar34 + psz);
  dVar12 = cos(local_110);
  local_a8 = sin(local_110);
  local_a8 = -local_a8;
  dVar13 = sin(local_110);
  dVar14 = cos(local_110);
  IVar18.x = (float)(dVar12 * dVar33 + local_a8 * dVar11);
  IVar18.y = (float)(dVar13 * dVar33 + dVar14 * dVar11);
  __return_storage_ptr__->_M_elems[1] = IVar18;
  dVar11 = cos(local_110);
  dVar12 = (double)(float)((double)fVar35 + psz);
  local_f8 = sin(local_110);
  local_f8 = -local_f8;
  dVar13 = sin(local_110);
  dVar14 = cos(local_110);
  IVar19.x = (float)(dVar11 * dVar33 + local_f8 * dVar12);
  IVar19.y = (float)(dVar13 * dVar33 + dVar14 * dVar12);
  __return_storage_ptr__->_M_elems[2] = IVar19;
  dVar33 = cos(local_110);
  local_e8 = sin(local_110);
  local_e8 = -local_e8;
  dVar11 = sin(local_110);
  dVar13 = cos(local_110);
  IVar20.x = (float)(dVar33 * dVar15 + local_e8 * dVar12);
  IVar20.y = (float)(dVar11 * dVar15 + dVar13 * dVar12);
  __return_storage_ptr__->_M_elems[3] = IVar20;
  lVar9 = 0;
  do {
    pIVar1 = __return_storage_ptr__->_M_elems + lVar9;
    fVar34 = pIVar1->y;
    fVar35 = pIVar1[1].x;
    fVar4 = pIVar1[1].y;
    pIVar2 = __return_storage_ptr__->_M_elems + lVar9;
    pIVar2->x = pIVar1->x + (float)local_88;
    pIVar2->y = fVar34 + local_88._4_4_;
    pIVar2[1].x = fVar35 + (float)local_88;
    pIVar2[1].y = fVar4 + local_88._4_4_;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 4);
  return __return_storage_ptr__;
}

Assistant:

std::array<ImVec2, 4> VHMBBCalculate(std::vector<ImVec2> hull, double psz) {
	std::array<ImVec2, 4> box;

	double mbAngle = 0, cumulative_angle = 0;
	double mbArea = DBL_MAX; // fake area to initialise
	ImVec2 mbb, mba, origin; // Box bottom left, box top right

	// Find the lowest hull point, if it's below the x-axis just bring it up to
	// compensate
	// NOTE: we're not modifying the actual hull point, just a copy
	origin.x = DBL_MAX;
	origin.y = DBL_MAX;

	// find bottom corner
	for (size_t i = 0; i < hull.size(); i++) {
		if (hull[i].y < origin.y) origin.y = hull[i].y;
		if (hull[i].x < origin.x) origin.x = hull[i].x;
	}

	// transpose
	for (size_t i = 0; i < hull.size(); i++) {
		hull[i].x -= origin.x;
		hull[i].y -= origin.y;
	}

	// rotate hull on each side and work out the smallest area
	for (size_t i = 0; i < hull.size(); i++) {
		int ni = i + 1;
		double area;

		ImVec2 current = hull[i];
		ImVec2 next    = hull[ni % hull.size()];

		double angle = VHAngleToX(current, next); // angle formed between current and next hull points;
		cumulative_angle += angle;

		double top, bot, left, right; // bounding rect limits
		top = right = DBL_MIN;
		bot = left = DBL_MAX;

		for (size_t x = 0; x < hull.size(); x++) {
			ImVec2 rp = VHRotateV(hull[x], -angle);

			hull[x] = rp;

			if (rp.y > top) top     = rp.y;
			if (rp.y < bot) bot     = rp.y;
			if (rp.x > right) right = rp.x;
			if (rp.x < left) left   = rp.x;
		}
		area = (right - left) * (top - bot);

		if (area < mbArea) {
			mbArea  = area;
			mbAngle = cumulative_angle; // total angle we've had to rotate the board
			                            // to get to this orientation;
			mba = ImVec2(left, bot);
			mbb = ImVec2(right, top);
		}
	} // for all points on hull

	// expand by pin size
	mba.x -= psz;
	mba.y -= psz;
	mbb.x += psz;
	mbb.y += psz;

	// Form our rectangle, has to be all 4 points as it's a polygon now that'll be
	// rotated
	box[0] = VHRotateV(mba, +mbAngle);
	box[1] = VHRotateV(ImVec2(mbb.x, mba.y), +mbAngle);
	box[2] = VHRotateV(mbb, +mbAngle);
	box[3] = VHRotateV(ImVec2(mba.x, mbb.y), +mbAngle);

	// Transpose MBB back
	for (size_t i = 0; i < 4; i++) {
		box[i].x += origin.x;
		box[i].y += origin.y;
	}

	return box;
}